

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall
wasm::FunctionValidator::validateCallParamsAndResult<wasm::CallIndirect>
          (FunctionValidator *this,CallIndirect *curr,HeapType sigType,Expression *printable)

{
  Type left;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  Expression **ppEVar4;
  ostream *poVar5;
  Function *this_00;
  Type right;
  Function *func;
  Type local_88;
  uintptr_t local_80;
  uintptr_t local_78;
  Type *local_70;
  Type *param;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  size_t i;
  Signature sig;
  Expression *printable_local;
  CallIndirect *curr_local;
  FunctionValidator *this_local;
  HeapType sigType_local;
  
  sig.results.id = (uintptr_t)printable;
  this_local = (FunctionValidator *)sigType.id;
  bVar1 = HeapType::isSignature((HeapType *)&this_local);
  bVar1 = shouldBeTrue<wasm::Expression*>
                    (this,bVar1,(Expression *)sig.results.id,"Heap type must be a signature type");
  if (bVar1) {
    _i = HeapType::getSignature((HeapType *)&this_local);
    sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      (&(curr->operands).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    sVar3 = wasm::Type::size((Type *)&i);
    bVar1 = shouldBeTrue<wasm::Expression*>
                      (this,sVar2 == sVar3,(Expression *)sig.results.id,
                       "call* param number must match");
    if (bVar1) {
      __range2 = (Type *)0x0;
      join_0x00000010_0x00000000_ =
           (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
           wasm::Type::begin((Type *)&i);
      _param = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end((Type *)&i);
      while (bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                               ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                &__end2.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                         *)&param), bVar1) {
        local_70 = wasm::Type::Iterator::operator*
                             ((Iterator *)
                              &__end2.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index);
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(curr->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(size_t)__range2);
        local_78 = ((*ppEVar4)->type).id;
        local_80 = local_70->id;
        bVar1 = shouldBeSubType(this,(Type)local_78,(Type)local_80,(Expression *)sig.results.id,
                                "call param types must match");
        if ((!bVar1) && ((this->info->quiet & 1U) == 0)) {
          poVar5 = getStream(this);
          poVar5 = std::operator<<(poVar5,"(on argument ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)__range2);
          std::operator<<(poVar5,")\n");
        }
        __range2 = (Type *)((long)&__range2->id + 1);
        ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                  ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                   &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                  );
      }
      if ((curr->isReturn & 1U) == 0) {
        shouldBeEqualOrFirstIsUnreachable<wasm::Expression*,wasm::Type>
                  (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)7>).
                              super_Expression.type.id,sig.params,(Expression *)sig.results.id,
                   "call* type must match callee return type");
      }
      else {
        local_88.id = (curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.
                      type.id;
        wasm::Type::Type((Type *)&func,unreachable);
        shouldBeEqual<wasm::Expression*,wasm::Type>
                  (this,local_88,(Type)func,(Expression *)sig.results.id,
                   "return_call* should have unreachable type");
        this_00 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
                  getFunction(&(this->
                               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                               ).
                               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                               .
                               super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             );
        bVar1 = shouldBeTrue<wasm::CallIndirect*>
                          (this,this_00 != (Function *)0x0,curr,"function not defined");
        if (bVar1) {
          left.id = sig.params.id;
          right = Function::getResults(this_00);
          shouldBeSubType(this,left,right,(Expression *)sig.results.id,
                          "return_call* callee return type must match caller return type");
        }
      }
    }
  }
  return;
}

Assistant:

void validateCallParamsAndResult(T* curr,
                                   HeapType sigType,
                                   Expression* printable) {
    if (!shouldBeTrue(sigType.isSignature(),
                      printable,
                      "Heap type must be a signature type")) {
      return;
    }
    auto sig = sigType.getSignature();
    if (!shouldBeTrue(curr->operands.size() == sig.params.size(),
                      printable,
                      "call* param number must match")) {
      return;
    }
    size_t i = 0;
    for (const auto& param : sig.params) {
      if (!shouldBeSubType(curr->operands[i]->type,
                           param,
                           printable,
                           "call param types must match") &&
          !info.quiet) {
        getStream() << "(on argument " << i << ")\n";
      }
      ++i;
    }
    if (curr->isReturn) {
      shouldBeEqual(curr->type,
                    Type(Type::unreachable),
                    printable,
                    "return_call* should have unreachable type");
      auto* func = getFunction();
      if (!shouldBeTrue(!!func, curr, "function not defined")) {
        return;
      }
      shouldBeSubType(
        sig.results,
        func->getResults(),
        printable,
        "return_call* callee return type must match caller return type");
    } else {
      shouldBeEqualOrFirstIsUnreachable(
        curr->type,
        sig.results,
        printable,
        "call* type must match callee return type");
    }
  }